

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O1

CodeBlock * __thiscall cppgenerate::CodeBlock::addLine(CodeBlock *this,string *line)

{
  ostream *poVar1;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->m_indent);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_40,local_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(line->_M_dataplus)._M_p,line->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return this;
}

Assistant:

CodeBlock& CodeBlock::addLine( std::string line ){
    m_text << std::string( m_indent, ' ' ) << line << std::endl;

    return *this;
}